

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

ON_TextureCoordinates * __thiscall
ON_Mesh::SetCachedTextureCoordinatesEx
          (ON_Mesh *this,ON_TextureMapping *mapping,ON_Xform *mesh_xform,bool bLazy,bool bSeamCheck)

{
  TYPE TVar1;
  int iVar2;
  ON_TextureCoordinates *pOVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ON_UUID *b;
  long lVar8;
  ON_Xform *pOVar9;
  ON_Xform *pOVar10;
  int *Tsd;
  long lVar11;
  ON_TextureCoordinates *tag;
  ON_3fPoint *p;
  byte bVar12;
  ON_SimpleArray<int> Tside;
  ON_3dPoint T;
  ON_TextureMapping mp;
  ON_SimpleArray<int> *local_2d0;
  double local_2c0;
  ON_SimpleArray<int> local_2b0;
  ON_3dPoint local_298;
  ON_3dPoint local_278;
  ON_TextureMapping local_260;
  
  bVar12 = 0;
  TVar1 = mapping->m_type;
  if ((TVar1 != srfp_mapping) &&
     (((((mapping->m_projection == ray_projection || (TVar1 == wcsbox_projection)) ||
        (TVar1 == box_mapping)) || ((TVar1 == cylinder_mapping && (mapping->m_bCapped == true)))) &&
      (bVar5 = HasVertexNormals(this), !bVar5)))) {
    ComputeVertexNormals(this);
  }
  ON_TextureMapping::ON_TextureMapping(&local_260,mapping);
  local_2b0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
  local_2b0.m_a = (int *)0x0;
  local_2b0.m_count = 0;
  local_2b0.m_capacity = 0;
  if (bSeamCheck) {
    local_2c0 = 1.0;
    if (local_260.m_type == cylinder_mapping) {
      if (local_260.m_texture_space == divided) {
LAB_004de179:
        local_2d0 = &local_2b0;
        local_2c0 = 0.6666666666666666;
      }
      else {
        local_2d0 = (ON_SimpleArray<int> *)0x0;
      }
    }
    else {
      local_2d0 = (ON_SimpleArray<int> *)0x0;
      if (local_260.m_type != sphere_mapping) {
        if (local_260.m_type != box_mapping) goto LAB_004de1d4;
        local_2d0 = &local_2b0;
        if (local_260.m_texture_space != single) {
          if (local_260.m_texture_space != divided) goto LAB_004de15a;
          if (local_260.m_bCapped == true) goto LAB_004de179;
        }
      }
    }
    iVar2 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
    iVar6 = TriangleCount(this);
    iVar7 = QuadCount(this);
    if (iVar2 < iVar6 * 3 + iVar7 * 4) {
      pOVar9 = &ON_Xform::IdentityTransformation;
      pOVar10 = &local_260.m_uvw;
      for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
        pOVar10->m_xform[0][0] = pOVar9->m_xform[0][0];
        pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar12 * -2 + 1) * 8);
        pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar12 * -2 + 1) * 8);
      }
      bVar4 = 1;
      goto LAB_004de1dd;
    }
  }
  else {
LAB_004de15a:
    local_2c0 = 1.0;
    local_2d0 = (ON_SimpleArray<int> *)0x0;
  }
LAB_004de1d4:
  bVar4 = 0;
LAB_004de1dd:
  if (0 < (this->m_TC).m_count) {
    lVar11 = 0;
    lVar8 = 0;
    do {
      pOVar3 = (this->m_TC).m_a;
      b = ON_ModelComponent::Id(&mapping->super_ON_ModelComponent);
      bVar5 = ::operator==((ON_UUID_struct *)((pOVar3->m_tag).m_mapping_id.Data4 + lVar11 + -8),b);
      if (bVar5) {
        pOVar3 = (this->m_TC).m_a;
        tag = (ON_TextureCoordinates *)((pOVar3->m_tag).m_mapping_id.Data4 + lVar11 + -8);
        if (bLazy && pOVar3 != (ON_TextureCoordinates *)0x0) {
          bVar5 = ON_TextureMapping::HasMatchingTextureCoordinates
                            (mapping,(ON_MappingTag *)tag,mesh_xform);
          if (bVar5) goto LAB_004de333;
          goto LAB_004de25d;
        }
        if (pOVar3 != (ON_TextureCoordinates *)0x0) goto LAB_004de25d;
        break;
      }
      lVar8 = lVar8 + 1;
      lVar11 = lVar11 + 0xb8;
    } while (lVar8 < (this->m_TC).m_count);
  }
  ON_ClassArray<ON_TextureCoordinates>::AppendNew(&this->m_TC);
  lVar8 = (long)(this->m_TC).m_count;
  tag = (ON_TextureCoordinates *)0x0;
  if (0 < lVar8) {
    tag = (this->m_TC).m_a + lVar8 + -1;
  }
LAB_004de25d:
  bVar5 = ON_TextureMapping::GetTextureCoordinates
                    (&local_260,this,&tag->m_T,mesh_xform,false,local_2d0);
  if (bVar5) {
    ON_MappingTag::Set(&tag->m_tag,mapping);
    if (((mesh_xform != (ON_Xform *)0x0) && (bVar5 = ON_Xform::IsValid(mesh_xform), bVar5)) &&
       ((bVar5 = ON_Xform::IsIdentity(mesh_xform,0.0), !bVar5 &&
        (bVar5 = ON_Xform::IsZero(mesh_xform), !bVar5)))) {
      pOVar9 = mesh_xform;
      pOVar10 = &(tag->m_tag).m_mesh_xform;
      for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
        pOVar10->m_xform[0][0] = pOVar9->m_xform[0][0];
        pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar12 * -2 + 1) * 8);
        pOVar10 = (ON_Xform *)((long)pOVar10 + (ulong)bVar12 * -0x10 + 8);
      }
    }
    tag->m_dim = 2;
    if (((bool)(bVar4 & 0 < (this->m_F).m_count)) &&
       (iVar2 = (tag->m_T).m_count, iVar2 == (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count))
    {
      Tsd = local_2b0.m_a;
      if (local_2b0.m_count != iVar2) {
        Tsd = (int *)0x0;
      }
      if (local_2d0 == (ON_SimpleArray<int> *)0x0) {
        Tsd = (int *)0x0;
      }
      AdjustMeshPeriodicTextureCoordinatesHelper
                (this,mesh_xform,&((tag->m_T).m_a)->x,3,Tsd,local_2c0,&local_260);
      pOVar9 = &mapping->m_uvw;
      bVar5 = ON_Xform::IsIdentity(pOVar9,0.0);
      if (((!bVar5) && (bVar5 = ON_Xform::IsZero(pOVar9), !bVar5)) &&
         (lVar8 = (long)(tag->m_T).m_count, 0 < lVar8)) {
        p = (tag->m_T).m_a;
        do {
          ON_3dPoint::operator=(&local_298,p);
          ON_Xform::operator*(&local_278,pOVar9,&local_298);
          local_298.z = local_278.z;
          local_298.x = local_278.x;
          local_298.y = local_278.y;
          ON_3fPoint::operator=(p,&local_298);
          p = p + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
    }
  }
  else {
    ON_ClassArray<ON_TextureCoordinates>::Remove
              (&this->m_TC,(int)((ulong)((long)tag - (long)(this->m_TC).m_a) >> 3) * -0x1642c859);
    tag = (ON_TextureCoordinates *)0x0;
  }
LAB_004de333:
  ON_SimpleArray<int>::~ON_SimpleArray(&local_2b0);
  ON_TextureMapping::~ON_TextureMapping(&local_260);
  return tag;
}

Assistant:

const ON_TextureCoordinates* ON_Mesh::SetCachedTextureCoordinatesEx(
        const class ON_TextureMapping& mapping,
        const class ON_Xform* mesh_xform,
        bool bLazy,
        bool bSeamCheck
        )
{
  if ( mapping.RequiresVertexNormals() && !HasVertexNormals() )
    ComputeVertexNormals();

  ON_TextureMapping mp = mapping;
  double two_pi_tc = 1.0;
  ON_SimpleArray<int> Tside;
  ON_SimpleArray<int>* Tsd = 0;

  if (bSeamCheck)
  {
    bSeamCheck = SeamCheckHelper(mp, two_pi_tc, Tside, Tsd) && HasSharedVertices(*this);
    if (bSeamCheck)
      mp.m_uvw = ON_Xform::IdentityTransformation;
  }

  ON_TextureCoordinates* TC = 0;
  {
    for ( int i = 0; i < m_TC.Count(); i++ )
    {
      if ( m_TC[i].m_tag.m_mapping_id == mapping.Id() )
      {
        TC = &m_TC[i];
        break;
      }
    }
  }
  if ( bLazy && TC && mapping.HasMatchingTextureCoordinates( TC->m_tag, mesh_xform ) )
    return TC;

  if ( !TC )
  {
    m_TC.AppendNew();
    TC = m_TC.Last();
  }

  // Use mp instead of mapping to call GetTextureCoordinates()
  // because m_uvw must be the identity if we have seams.
  if ( !mp.GetTextureCoordinates( *this,TC->m_T,mesh_xform,false,Tsd) )
  {
    int tci = (int)(TC - m_TC.Array());
    m_TC.Remove(tci);
    return 0;
  }

  TC->m_tag.Set(mapping);
  if (    mesh_xform && mesh_xform->IsValid()
       && !mesh_xform->IsIdentity()
       && !mesh_xform->IsZero()
     )
  {
    TC->m_tag.m_mesh_xform = *mesh_xform;
  }

  TC->m_dim = 2;

  if ( bSeamCheck &&  m_F.Count() > 0 && TC->m_T.Count() == m_V.Count() )
  {
    float* mesh_T = (float*)TC->m_T.Array();
    int mesh_T_stride = sizeof(TC->m_T[0])/sizeof(mesh_T[0]);
    if ( Tsd && Tside.Count() != m_V.Count() )
      Tsd = 0;
    AdjustMeshPeriodicTextureCoordinatesHelper( *this, mesh_xform, mesh_T, mesh_T_stride, Tsd ? Tside.Array() : 0, two_pi_tc, mp );
    mesh_T = 0; // when the array is grown, the pointer may become invalid
    if ( !mapping.m_uvw.IsIdentity() && !mapping.m_uvw.IsZero() )
    {
      // Apply the uvw transformation that is on mapping
      // to the texture coordinates.
      ON_3dPoint T;
      int vi, vcnt = TC->m_T.Count();
      ON_3fPoint* meshT = TC->m_T.Array();
      for ( vi = 0; vi < vcnt; vi++ )
      {
        T = meshT[vi];
        T = mapping.m_uvw*T;
        meshT[vi] = T;
      }
    }
  }

  return TC;
}